

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O2

void Ssw_RarManInitialize(Ssw_RarMan_t *p,Vec_Int_t *vInit)

{
  uint uVar1;
  int iVar2;
  word *pwVar3;
  Aig_Man_t *pAVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  word *pwVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  
  pwVar3 = Ssw_RarObjSim(p,p->pAig->pConst1->Id);
  uVar1 = p->pPars->nWords;
  uVar10 = 0;
  uVar9 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    pwVar3[uVar10] = 0xffffffffffffffff;
  }
  Ssw_RarManAssingRandomPis(p);
  if (vInit == (Vec_Int_t *)0x0) {
    for (iVar2 = 0; iVar2 < p->pAig->nRegs; iVar2 = iVar2 + 1) {
      pAVar6 = Saig_ManLi(p->pAig,iVar2);
      pAVar7 = Saig_ManLo(p->pAig,iVar2);
      pwVar3 = Ssw_RarObjSim(p,pAVar6->Id);
      pwVar8 = Ssw_RarObjSim(p,pAVar7->Id);
      uVar1 = p->pPars->nWords;
      uVar9 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar9 = 0;
      }
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        pwVar8[uVar10] = pwVar3[uVar10];
      }
    }
  }
  else {
    pAVar4 = p->pAig;
    iVar2 = pAVar4->nRegs;
    if (vInit->nSize != p->pPars->nWords * iVar2) {
      __assert_fail("Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/ssw/sswRarity.c"
                    ,0x1ae,"void Ssw_RarManInitialize(Ssw_RarMan_t *, Vec_Int_t *)");
    }
    for (iVar11 = 0; iVar11 < iVar2; iVar11 = iVar11 + 1) {
      pvVar5 = Vec_PtrEntry(pAVar4->vCis,pAVar4->nTruePis + iVar11);
      pwVar3 = Ssw_RarObjSim(p,*(int *)((long)pvVar5 + 0x24));
      for (lVar12 = 0; lVar12 < p->pPars->nWords; lVar12 = lVar12 + 1) {
        iVar2 = Vec_IntEntry(vInit,p->pAig->nRegs * (int)lVar12 + iVar11);
        pwVar3[lVar12] = -(ulong)(iVar2 != 0);
      }
      pAVar4 = p->pAig;
      iVar2 = pAVar4->nRegs;
    }
  }
  return;
}

Assistant:

void Ssw_RarManInitialize( Ssw_RarMan_t * p, Vec_Int_t * vInit )
{
    Aig_Obj_t * pObj, * pObjLi;
    word * pSim, * pSimLi;
    int w, i;
    // constant
    pObj = Aig_ManConst1( p->pAig );
    pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
    for ( w = 0; w < p->pPars->nWords; w++ )
        pSim[w] = ~(word)0;
    // primary inputs
    Ssw_RarManAssingRandomPis( p );
    // flop outputs
    if ( vInit )
    {
        assert( Vec_IntSize(vInit) == Saig_ManRegNum(p->pAig) * p->pPars->nWords );
        Saig_ManForEachLo( p->pAig, pObj, i )
        {
            pSim = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = Vec_IntEntry(vInit, w * Saig_ManRegNum(p->pAig) + i) ? ~(word)0 : (word)0;
        }
    }
    else
    {
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObj, i )
        {
            pSimLi = Ssw_RarObjSim( p, Aig_ObjId(pObjLi) );
            pSim   = Ssw_RarObjSim( p, Aig_ObjId(pObj) );
            for ( w = 0; w < p->pPars->nWords; w++ )
                pSim[w] = pSimLi[w];
        }
    }
}